

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  LRUHandle *e;
  Mutex *__mutex;
  
  uVar1 = Hash(key->data_,key->size_,0);
  uVar2 = uVar1 >> 0x1c;
  __mutex = &this->shard_[uVar2].mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    e = HandleTable::Remove(&this->shard_[uVar2].table_,(Slice *)key->data_,(uint32_t)key->size_);
    LRUCache::FinishErase(this->shard_ + uVar2,e);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }